

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

string * __thiscall
cmFindProgramCommand::FindProgram_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&sStack_38);
  if (((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleFirst != false) ||
     ((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleOnly == true)) {
    FindAppBundle_abi_cxx11_(&sStack_38,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  if (__return_storage_ptr__->_M_string_length == 0) {
    if ((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleOnly == false) {
      FindNormalProgram_abi_cxx11_(&sStack_38,this);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
      if (__return_storage_ptr__->_M_string_length != 0) {
        return __return_storage_ptr__;
      }
    }
    if ((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleLast == true) {
      FindAppBundle_abi_cxx11_(&sStack_38,this);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindProgramCommand::FindProgram()
{
  std::string program = "";

  if(this->SearchAppBundleFirst || this->SearchAppBundleOnly)
    {
    program = FindAppBundle();
    }
  if(program.empty() && !this->SearchAppBundleOnly)
    {
    program = this->FindNormalProgram();
    }

  if(program.empty() && this->SearchAppBundleLast)
    {
    program = this->FindAppBundle();
    }
  return program;
}